

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tzfmt.cpp
# Opt level: O0

UnicodeString * __thiscall
icu_63::TimeZoneFormat::parseExemplarLocation
          (TimeZoneFormat *this,UnicodeString *text,ParsePosition *pos,UnicodeString *tzID)

{
  UBool UVar1;
  uint ei;
  int iVar2;
  int32_t iVar3;
  undefined4 extraout_var;
  MatchInfoCollection *pMVar4;
  int local_60;
  int32_t local_5c;
  int32_t i;
  int32_t matchIdx;
  LocalPointerBase<icu_63::TimeZoneNames::MatchInfoCollection> local_48;
  LocalPointer<icu_63::TimeZoneNames::MatchInfoCollection> exemplarMatches;
  int local_38;
  UErrorCode status;
  int32_t parsedPos;
  int32_t startIdx;
  UnicodeString *tzID_local;
  ParsePosition *pos_local;
  UnicodeString *text_local;
  TimeZoneFormat *this_local;
  
  ei = ParsePosition::getIndex(pos);
  local_38 = -1;
  UnicodeString::setToBogus(tzID);
  exemplarMatches.super_LocalPointerBase<icu_63::TimeZoneNames::MatchInfoCollection>.ptr._4_4_ =
       U_ZERO_ERROR;
  iVar2 = (*(this->fTimeZoneNames->super_UObject)._vptr_UObject[0xf])
                    (this->fTimeZoneNames,text,(ulong)ei,0x40,
                     (undefined1 *)
                     ((long)&exemplarMatches.
                             super_LocalPointerBase<icu_63::TimeZoneNames::MatchInfoCollection>.ptr
                     + 4));
  LocalPointer<icu_63::TimeZoneNames::MatchInfoCollection>::LocalPointer
            ((LocalPointer<icu_63::TimeZoneNames::MatchInfoCollection> *)&local_48,
             (MatchInfoCollection *)CONCAT44(extraout_var,iVar2));
  UVar1 = ::U_FAILURE(exemplarMatches.
                      super_LocalPointerBase<icu_63::TimeZoneNames::MatchInfoCollection>.ptr._4_4_);
  if (UVar1 == '\0') {
    local_5c = -1;
    UVar1 = LocalPointerBase<icu_63::TimeZoneNames::MatchInfoCollection>::isNull(&local_48);
    if (UVar1 == '\0') {
      local_60 = 0;
      while( true ) {
        pMVar4 = LocalPointerBase<icu_63::TimeZoneNames::MatchInfoCollection>::operator->(&local_48)
        ;
        iVar3 = TimeZoneNames::MatchInfoCollection::size(pMVar4);
        if (iVar3 <= local_60) break;
        pMVar4 = LocalPointerBase<icu_63::TimeZoneNames::MatchInfoCollection>::operator->(&local_48)
        ;
        iVar3 = TimeZoneNames::MatchInfoCollection::getMatchLengthAt(pMVar4,local_60);
        if (local_38 < (int)(ei + iVar3)) {
          local_5c = local_60;
          pMVar4 = LocalPointerBase<icu_63::TimeZoneNames::MatchInfoCollection>::operator->
                             (&local_48);
          iVar3 = TimeZoneNames::MatchInfoCollection::getMatchLengthAt(pMVar4,local_60);
          local_38 = ei + iVar3;
        }
        local_60 = local_60 + 1;
      }
      if (0 < local_38) {
        ParsePosition::setIndex(pos,local_38);
        pMVar4 = LocalPointerBase<icu_63::TimeZoneNames::MatchInfoCollection>::getAlias(&local_48);
        getTimeZoneID(this,pMVar4,local_5c,tzID);
      }
    }
    iVar3 = UnicodeString::length(tzID);
    if (iVar3 == 0) {
      ParsePosition::setErrorIndex(pos,ei);
    }
  }
  else {
    ParsePosition::setErrorIndex(pos,ei);
  }
  LocalPointer<icu_63::TimeZoneNames::MatchInfoCollection>::~LocalPointer
            ((LocalPointer<icu_63::TimeZoneNames::MatchInfoCollection> *)&local_48);
  return tzID;
}

Assistant:

UnicodeString&
TimeZoneFormat::parseExemplarLocation(const UnicodeString& text, ParsePosition& pos, UnicodeString& tzID) const {
    int32_t startIdx = pos.getIndex();
    int32_t parsedPos = -1;
    tzID.setToBogus();

    UErrorCode status = U_ZERO_ERROR;
    LocalPointer<TimeZoneNames::MatchInfoCollection> exemplarMatches(fTimeZoneNames->find(text, startIdx, UTZNM_EXEMPLAR_LOCATION, status));
    if (U_FAILURE(status)) {
        pos.setErrorIndex(startIdx);
        return tzID;
    }
    int32_t matchIdx = -1;
    if (!exemplarMatches.isNull()) {
        for (int32_t i = 0; i < exemplarMatches->size(); i++) {
            if (startIdx + exemplarMatches->getMatchLengthAt(i) > parsedPos) {
                matchIdx = i;
                parsedPos = startIdx + exemplarMatches->getMatchLengthAt(i);
            }
        }
        if (parsedPos > 0) {
            pos.setIndex(parsedPos);
            getTimeZoneID(exemplarMatches.getAlias(), matchIdx, tzID);
        }
    }

    if (tzID.length() == 0) {
        pos.setErrorIndex(startIdx);
    }

    return tzID;
}